

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cc
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  ostream *poVar4;
  Index row;
  long lVar5;
  long lVar6;
  Index row_1;
  long lVar7;
  ulong uVar8;
  Scalar *dst_ptr;
  double *pdVar9;
  int i;
  uint uVar10;
  Matrix3d *pMVar11;
  Matrix3d *pMVar13;
  ulong uVar14;
  byte bVar15;
  string *psVar23;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Vector2d VVar22;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  matvec;
  MatrixXd lighttime_truth;
  MatrixXd pred_meas;
  MatrixXd true_meas;
  MatrixXd pos_ECI2;
  MatrixXd iau1980;
  MatrixXd nut80;
  Matrix3d R;
  Vector3d pos2;
  Vector3d vel1;
  MatrixXd t_R_test;
  Vector3d pos1;
  Vector3d pos_ECI;
  EGM96Grav gravmodel;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_598;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  MatrixXd local_558;
  DenseStorage<double,__1,__1,__1,_0> local_540;
  MatrixXd local_528;
  DenseStorage<double,__1,__1,__1,_0> local_510;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  MatrixXd local_3d8;
  MatrixXd local_3c0;
  Matrix3d local_3a8;
  string local_358;
  double local_338;
  double dStack_330;
  double local_328;
  double local_318;
  double dStack_310;
  double local_308;
  DenseStorage<double,__1,__1,__1,_0> local_300;
  DenseStorage<double,__1,__1,__1,_0> local_2e8;
  MatrixXd local_2d0;
  undefined1 local_2b8 [80];
  Propagator local_268;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  undefined1 local_e8 [16];
  double local_d8;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  EGM96Grav local_b0;
  ulong uVar12;
  
  bVar15 = 0;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 0x11;
  local_c8 = 0x7d4d1be5;
  uStack_c4 = 0x40d2b75c;
  uStack_c0 = 0xf704fa5b;
  uStack_bc = 0xc0e255a1;
  local_b8 = 0xc044859502c2d3b4;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"../data/nut80.csv","");
  Util::LoadDatFile(&local_3c0,&local_358,0x6a,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,"../data/iau1980modified.csv","");
  Util::LoadDatFile(&local_3d8,&local_418,0x449b,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  dVar2 = Util::JulianDateNatural2JD(2017.0,12.0,1.0,0.0,0.0,48.0000384);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Julian Date: ",0xd);
  poVar4 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_598.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_598.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x168);
  local_598.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_598.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 5;
  lVar7 = 0;
  do {
    *(undefined8 *)
     ((long)((local_598.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_598.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar7 + 8);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_598.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7 + 0x18) = 0;
    *(undefined8 *)
     ((long)((local_598.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7 + 0x20) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)((local_598.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar7 + 0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)((local_598.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7 + 0x38) = 0;
    *(undefined8 *)
     ((long)((local_598.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar7 + 0x40) = 0x3ff0000000000000;
    lVar7 = lVar7 + 0x48;
  } while (lVar7 != 0x168);
  local_598.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_598.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 5;
  Util::ECEF2ECI(&local_3a8,dVar2,&local_3c0,&local_3d8,&local_598);
  dVar2 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[7] * -6.718 +
          local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4] * -30844.07232 +
          local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] * -28738.32184;
  local_e8._8_4_ = SUB84(dVar2,0);
  local_e8._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * -6.718 +
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3] * -30844.07232 +
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * -28738.32184;
  local_e8._12_4_ = (int)((ulong)dVar2 >> 0x20);
  local_d8 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * -6.718 +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * -30844.07232 +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] * -28738.32184;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error [cm]: \n",0xd);
  local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 100000.0;
  local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (double)&local_c8;
  local_268.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (double)local_e8;
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                              *)(local_2b8 + 0x50));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"../data/t_ECF_test.csv","");
  Util::LoadDatFile(&local_2d0,&local_438,0x361,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  local_3f8 = 6378.1363;
  dStack_3f0 = 6378.1363;
  local_3e8 = 6378.1363;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ECEF Test Position: \n",0x15);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_3f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  dVar2 = Util::JulianDateNatural2JD(2018.0,3.0,23.0,8.0,55.0,3.0);
  local_268._0_8_ = 1.48219693752374e-323;
  local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 4.27366783652678e-321;
  local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_510,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)(local_2b8 + 0x50));
  lVar7 = 0;
  do {
    Util::ECEF2ECI((Matrix3d *)(local_2b8 + 0x50),
                   local_2d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data[lVar7] / 86400.0 + dVar2,&local_3c0,&local_3d8,&local_598);
    pMVar11 = (Matrix3d *)(local_2b8 + 0x50);
    pMVar13 = &local_3a8;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
      [0] = (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[0];
      pMVar11 = (Matrix3d *)((long)pMVar11 + ((ulong)bVar15 * -2 + 1) * 8);
      pMVar13 = (Matrix3d *)((long)pMVar13 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    pdVar9 = local_510.m_data + local_510.m_rows * lVar7;
    local_268._0_8_ =
         dStack_3f0 *
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_3f8 *
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_3e8 *
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = dStack_3f0 *
               local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4] +
               local_3f8 *
               local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] +
               local_3e8 *
               local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7];
    local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] * dStack_3f0 +
               local_3e8 *
               local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] +
               local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] * local_3f8;
    if (((ulong)pdVar9 & 7) == 0) {
      if (((uint)pdVar9 >> 3 & 1) != 0) {
        *pdVar9 = (double)local_268._0_8_;
      }
      uVar10 = (uint)((ulong)pdVar9 >> 3) & 1;
      memcpy((void *)((long)pdVar9 + (ulong)(uVar10 * 8)),local_2b8 + (ulong)(uVar10 * 8) + 0x50,
             (ulong)(uVar10 + 2 + ~uVar10 & 2) * 8 + 0x10);
      if (((ulong)pdVar9 >> 3 & 1) == 0) {
        pdVar9[2] = local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[1];
      }
    }
    else {
      pdVar9[2] = local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
      *pdVar9 = (double)local_268._0_8_;
      pdVar9[1] = local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0];
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x361);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"../data/pred_ECIpos.csv","")
  ;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_2e8,&local_510);
  Util::Eigen2csv(&local_458,(MatrixXd *)&local_2e8);
  free(local_2e8.m_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  VehicleState::Propagator::Propagator((Propagator *)(local_2b8 + 0x50));
  local_268.mu_ = 398600.4415;
  local_268.mu_sun_ = 132712440018.0;
  local_268.mu_moon_ = 4902.800066;
  local_268.AU_ = 149597870.7;
  local_268.J2_ = 0.00108248;
  local_268.J3_ = 2.5327e-06;
  local_268.Rearth_ = 6378.1363;
  local_268.earthrotationspeed_ = 7.292115146706979e-05;
  local_268.C_D_ = 1.88;
  local_268.A_ = 15.0;
  local_268.m_ = 2000.0;
  local_268.rho_0_ = 3.614e-13;
  local_268.r0_ = 7078.1363;
  local_268.H_ = 88.667;
  local_268._0_5_ = 0x100000000;
  Util::EGM96Grav::EGM96Grav(&local_b0);
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_478,"../data/egm96_C_normalized.csv","");
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_498,"../data/egm96_S_normalized.csv","");
  Util::EGM96Grav::LoadNormCoeffs(&local_b0,&local_478,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  Util::EGM96Grav::NormCoeffs2Reg(&local_b0);
  local_b0.mu_ = local_268.mu_;
  local_b0.Rearth_ = local_268.Rearth_;
  local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 6984.46459301679;
  local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 1612.22237259524;
  local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 13.0914313353482;
  local_268.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = -1.67664476668291;
  local_268.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 7.26144494619245;
  local_268.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.259889921085112;
  uVar16 = 0;
  uVar17 = 0x40000000;
  uVar18 = 0;
  uVar19 = 0;
  uVar20 = 0;
  uVar21 = 0x3ff00000;
  local_268.gravmodel_ = &local_b0;
  local_b0.nut80ptr_ = &local_3c0;
  local_b0.iau1980ptr_ = &local_3d8;
  local_268.t_JD_ = Util::JulianDateNatural2JD(2018.0,2.0,1.0,5.0,0.0,0.0);
  local_268.abstol_ = 1e-16;
  local_268.dt_var_ = 0.1;
  local_268.reltol_._0_4_ = 0xa4f8e0b4;
  local_268.reltol_._4_4_ = 0x3d20e374;
  local_268._0_5_ = 0x101010101;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b8,"../data/lighttime_truth.csv","");
  Util::LoadDatFile(&local_558,&local_4b8,0x71,7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4d8,"../data/LEO_Data_Apparent.csv","");
  Util::LoadDatFile(&local_528,&local_4d8,0x71,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._0_8_ = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x2;
  local_2b8._8_8_ = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x71;
  local_2b8._16_8_ = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_540,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_2b8);
  local_268.dt_var_ = -0.1;
  lVar5 = 0;
  lVar7 = 0;
  local_568 = uVar16;
  uStack_564 = uVar17;
  local_578 = uVar20;
  uStack_574 = uVar21;
  do {
    local_268.t_ = local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data
                   [lVar7 + local_558.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows * 6];
    local_338 = local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[lVar7];
    dStack_330 = local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [lVar7 + local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_rows];
    local_328 = local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[lVar7 + local_558.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows * 2];
    local_318 = local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[lVar7 + local_558.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows * 3];
    dStack_310 = local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [lVar7 + local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_rows * 4];
    local_308 = local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[lVar7 + local_558.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows * 5];
    dVar2 = local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data[local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * 2 + lVar7] / 299792.0;
    uStack_570 = uVar18;
    uStack_56c = uVar19;
    local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = local_338;
    local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dStack_330;
    local_268.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_328;
    local_268.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = local_318;
    local_268.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dStack_310;
    local_268.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_308;
    local_108 = local_338;
    dStack_100 = dStack_330;
    local_f8 = local_328;
    uVar18 = local_578;
    local_578 = local_568;
    uVar19 = uStack_574;
    uStack_574 = uStack_564;
    local_568 = uVar18;
    uStack_564 = uVar19;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pos1: \n",7);
    poVar4 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pos2: \n",7);
    poVar4 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_338);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Pos1 + tof*Vel1: \n",0x12);
    local_2b8._32_8_ = &local_318;
    local_2b8._0_8_ = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_108;
    local_2b8._24_8_ = dVar2;
    poVar4 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                *)local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tof: ",5);
    poVar4 = std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Pos1 + tof*Vel1 - Pos2: \n",0x19);
    local_2b8._40_8_ = &local_318;
    local_2b8._64_8_ = &local_338;
    local_2b8._8_8_ = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_108;
    local_2b8._32_8_ = dVar2;
    poVar4 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                *)local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    iVar3 = (int)local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[lVar7];
    uVar18 = 0x810624dd;
    uVar19 = 0xc0b7ff95;
    uVar16 = 0;
    uVar17 = 0x40955100;
    uVar20 = 0xd4fdf3b6;
    uVar21 = 0x409026f8;
    if (iVar3 != 1) {
      if (iVar3 == 2) {
        uVar18 = 0x147ae148;
        uVar19 = 0x409dcd2e;
        uVar16 = 0x5c28f5c3;
        uVar17 = 0x40b78ecf;
        uVar20 = 0xb645a1cb;
        uVar21 = 0xc08988f3;
      }
      else if (iVar3 == 3) {
        uVar18 = 0xb851eb85;
        uVar19 = 0x40a2ac9e;
        uVar16 = 0x4bc6a7f0;
        uVar17 = 0xc0b5bc57;
        uVar20 = 0xdf3b645a;
        uVar21 = 0x409f2a4f;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: bad case in measurement \n",0x20);
        uVar18 = local_578;
        uVar19 = uStack_574;
        uVar16 = uStack_570;
        uVar17 = uStack_56c;
        uVar20 = local_568;
        uVar21 = uStack_564;
      }
    }
    local_268.t_ = local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data
                   [local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 6 + lVar7];
    local_118 = CONCAT44(uVar21,uVar20);
    uStack_560 = uVar16;
    uStack_55c = uVar17;
    local_128 = uVar18;
    uStack_124 = uVar19;
    uStack_120 = uVar16;
    uStack_11c = uVar17;
    local_578 = uVar20;
    uStack_574 = uVar21;
    local_568 = uVar18;
    uStack_564 = uVar19;
    VVar22 = VehicleState::Propagator::GetRangeAndRate
                       ((Propagator *)local_2b8,(Vector3d *)(local_2b8 + 0x50),dVar2);
    psVar23._0_4_ =
         VVar22.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
         [0]._0_4_;
    pdVar9 = local_540.m_data + local_540.m_rows * lVar7;
    if (((ulong)pdVar9 & 7) == 0) {
      if (((uint)pdVar9 >> 3 & 1) != 0) {
        psVar23._0_4_ = (string *)local_2b8._0_8_;
        *pdVar9 = (double)local_2b8._0_8_;
      }
      uVar10 = (uint)((ulong)pdVar9 >> 3) & 1;
      uVar12 = (ulong)uVar10;
      uVar8 = (ulong)(2 - uVar10 & 0xfffffffe);
      uVar14 = uVar8 + uVar12;
      if (uVar8 != 0) {
        uVar8 = uVar12;
        do {
          lVar6 = uVar8 * 8;
          psVar23._0_4_ = *(string **)(local_2b8 + lVar6);
          uVar18 = *(undefined4 *)(local_2b8 + lVar6 + 4);
          uVar19 = *(undefined4 *)(local_2b8 + lVar6 + 8);
          uVar16 = *(undefined4 *)(local_2b8 + lVar6 + 0xc);
          puVar1 = (undefined8 *)((long)local_540.m_data + uVar8 * 8 + local_540.m_rows * lVar5);
          *puVar1 = psVar23._0_4_;
          *(undefined4 *)((long)puVar1 + 4) = uVar18;
          *(undefined4 *)(puVar1 + 1) = uVar19;
          *(undefined4 *)((long)puVar1 + 0xc) = uVar16;
          uVar8 = uVar8 + 2;
        } while (uVar8 < uVar14);
      }
      if (uVar12 != 0) {
        uVar14 = (ulong)(uint)((int)uVar14 << 3);
        psVar23._0_4_ = (string *)*(undefined8 *)(local_2b8 + uVar14);
        *(undefined8 *)((long)pdVar9 + uVar14) = *(undefined8 *)(local_2b8 + uVar14);
      }
    }
    else {
      lVar6 = 0;
      do {
        psVar23._0_4_ = (string *)*(undefined8 *)(local_2b8 + lVar6 * 8);
        *(undefined8 *)((long)local_540.m_data + lVar6 * 8 + local_540.m_rows * lVar5) =
             *(undefined8 *)(local_2b8 + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
    }
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 8;
    uVar18 = uStack_560;
    uVar19 = uStack_55c;
  } while (lVar7 != 0x71);
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar23._0_4_,&local_4f8,"../data/pred_meas.csv","");
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_300,&local_540);
  Util::Eigen2csv(&local_4f8,(MatrixXd *)&local_300);
  free(local_300.m_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  free(local_540.m_data);
  free(local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_558.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_b0.S_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_b0.S_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      );
  free(local_b0.C_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_b0.C_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      );
  free(local_268.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_510.m_data);
  free(local_2d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  if (local_598.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_598.
                    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_598.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_598.
                          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  free(local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_3c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return 0;
}

Assistant:

int main() {

	//////////////// Test ECI to ECEF //////////////////

	//precision
	std::cout << std::setprecision(17);

	//initialize position and time
	Eigen::Vector3d pos_ECEF(-28738.3218400000, -30844.0723200000, -6.71800000000000);

	//target position
	Eigen::Vector3d targ_pos_ECI(19165.44514777874, -37549.06140374086, -41.043609948282580);

	//load some data files
	Eigen::MatrixXd nut80 = Util::LoadDatFile("../data/nut80.csv", 106, 10);
	Eigen::MatrixXd iau1980 = Util::LoadDatFile("../data/iau1980modified.csv",17563, 5);

	//check Julian date algorithm
	double t_JD = Util::JulianDateNatural2JD(2017.0, 12.0, 1.0, 0.0, 0.0, 48.0000384);

	std::cout << "Julian Date: " << t_JD << "\n";

	// get rotation matrix
	std::vector<Eigen::Matrix3d> matvec(5, Eigen::Matrix3d::Identity(3,3));
	Eigen::Matrix3d R = Util::ECEF2ECI(t_JD, &nut80, &iau1980, &matvec);

	//rotate
	Eigen::Vector3d pos_ECI = R*pos_ECEF;

	//error
	std::cout << "Error [cm]: \n" << 100.0*1000.0*(targ_pos_ECI - pos_ECI) << "\n";

	//load the test times
	Eigen::MatrixXd t_R_test = Util::LoadDatFile("../data/t_ECF_test.csv",865,1);

	//load test position
	// Eigen::MatrixXd r_ECF_test = Util::LoadDatFile("../data/r_ECF_test.csv",1,3);
	Eigen::Vector3d pos_ECEF2(6378.136300000000, 6378.136300000000, 6378.136300000000);

	std::cout << "ECEF Test Position: \n" << pos_ECEF2 << "\n";

	//reset julian date to project epoch
	t_JD = Util::JulianDateNatural2JD(2018.0, 3.0, 23.0, 8.0, 55.0, 3.0);

	//initialize ECI matrix
	Eigen::MatrixXd pos_ECI2 = Eigen::MatrixXd::Zero(3,865);

	//perform rotations
	for (int i = 0; i < 865; ++i)	{
		R = Util::ECEF2ECI(t_JD + t_R_test(i,0)/(24.0*60.0*60.0), &nut80, &iau1980, &matvec);
		pos_ECI2.block(0,i,3,1) = R*pos_ECEF2;
	}

	//save data
	Util::Eigen2csv("../data/pred_ECIpos.csv", pos_ECI2);


	// exit(0);s
	////////////////////////////////////////////////////


	///////////////// Test Propagator /////////////////////

	//form a propagator object
	VehicleState::Propagator propobj;

	//set physics constants
	propobj.mu_ = 398600.4415; // km^3/sec^2
	propobj.mu_sun_ = 132712440018.0; //km^3/sec^2
	propobj.mu_moon_ = 4902.800066; //km^3/sec^2
	propobj.AU_ = 149597870.7;
	propobj.J2_ = 0.00108248;
	propobj.J3_ = 0.0000025327;
	propobj.Rearth_ = 6378.1363; //km
	propobj.earthrotationspeed_ = 7.292115146706979 * pow(10.0,-5.0); // rad/sec
	propobj.C_D_ = 1.88;
	propobj.A_ = 15; // m^2
	propobj.m_ = 2000.0; //kg
	propobj.rho_0_ = 3.614*pow(10.0,-13.0); //kg/m^3
	propobj.r0_ = 700.0 + propobj.Rearth_; //km
	propobj.H_ = 88.6670; //km

	//parameters
	propobj.useJ2_ = false;
	propobj.use20x20_ = true;
	propobj.usedrag_ = false;
	propobj.useSRP_ = false;
	propobj.useLuniSolar_ = false; //gravity of sun and moon

	//form a gravity object
	Util::EGM96Grav gravmodel;
	gravmodel.LoadNormCoeffs("../data/egm96_C_normalized.csv", "../data/egm96_S_normalized.csv");
	gravmodel.NormCoeffs2Reg();
	gravmodel.mu_ = propobj.mu_;
	gravmodel.Rearth_ = propobj.Rearth_;
	gravmodel.nut80ptr_ = &nut80; 
	gravmodel.iau1980ptr_ = &iau1980;
	propobj.gravmodel_ = &gravmodel;

	//set objects position and velocity (from lighttime_truth.mat)
	Eigen::Vector3d pos0;
	pos0[0] = 6984.46459301679;
	pos0[1] = 1612.22237259524;
	pos0[2] = 13.0914313353482;

	Eigen::Vector3d vel0;
	vel0[0] = -1.67664476668291;
	vel0[1] = 7.26144494619245;
	vel0[2] =  0.259889921085112;

	//set objects position and velocity (from HW5 assignment)
	// Eigen::Vector3d pos0;
	// pos0[0] = 6990077.798814194;
	// pos0[1] = 1617465.311978378;
	// pos0[2] = 22679.810569245355;
	// pos0 = pos0/1000.0; //convert units

	// Eigen::Vector3d vel0;
	// vel0[0] = -1675.13972506056;
	// vel0[1] = 7273.72441330686;
	// vel0[2] =  252.688512916741;
	// vel0 = vel0/1000.0; //convert units

	propobj.pos_ = pos0;
	propobj.vel_ = vel0;

	propobj.t_JD_ = Util::JulianDateNatural2JD(2018.0, 2.0, 1.0, 5.0, 0.0, 0.0);

	//set tolerance options
	propobj.abstol_ = 1.0*pow(10.0,-16.0);
	propobj.reltol_ = 3.0*pow(10.0,-14.0);
	propobj.dt_var_ = 0.1;

	// propagate
	// propobj.Propagate(21600.0, false);

	//true final position and velocity

	//lighttime_truth.mat
	// Eigen::Vector3d posf_true(-5153.82535324096, -4954.3861758395, -144.823727065817);
	// Eigen::Vector3d velf_true(5.17802136652852, -5.38752135424995, -0.211929233793885);

	// .xlsx file (20x20 only)
	Eigen::Vector3d posf_true(-5153.77192464701, -4954.43582198601, -144.832817220038);
	Eigen::Vector3d velf_true(5.17808108556007, -5.38747088174872, -0.211928868806419);

	//output
	// std::cout << "Final Position:\n" << propobj.pos_ << "\n" << "Error [m]:\n" << 1000.0*(propobj.pos_ - posf_true) << "\n";
	// std::cout << "Final Velocity:\n" << propobj.vel_ << "\n" << "Error [m/sec]:\n" << 1000.0*(propobj.vel_ - velf_true) << "\n";

	//////////////////////////////////////////////////////////////

	//////////////// Test Measurement Predictions /////////////////////

	//simple propagation
	propobj.useJ2_ = true;
	propobj.use20x20_ = true;
	propobj.usedrag_ = true;
	propobj.useSRP_ = true;
	propobj.useLuniSolar_ = true; //gravity of sun and moon

	// load true state and measurements
	Eigen::MatrixXd lighttime_truth = Util::LoadDatFile("../data/lighttime_truth.csv",113, 7);
	Eigen::MatrixXd true_meas = Util::LoadDatFile("../data/LEO_Data_Apparent.csv",113, 4);
	//initialize predicted measurements
	Eigen::MatrixXd pred_meas = Eigen::MatrixXd::Zero(2,113);

	//set observation station ECEF location
	Eigen::Vector3d obs_station1{-6143.584, 1364.250, 1033.743}; //atoll / Kwajalein
	Eigen::Vector3d obs_station2{1907.295, 6030.810, -817.119}; //diego garcia
	Eigen::Vector3d obs_station3{2390.310, -5564.341, 1994.578}; //arecibo

	double c = 299792.0; //speed of light km/sec

	propobj.dt_var_ = -0.1; //only doing backwards props

	//vector for use with choosing station
	Eigen::Vector3d obs_station_iter;

	// cycle through all the measurements, create a predicted measurement at each
	for (int i = 0; i < 113; ++i){
		
		//set time of object
		propobj.t_ = lighttime_truth(i,6);

		//set true state of object
		propobj.pos_ = lighttime_truth.block(i,0,1,3).transpose();
		propobj.vel_ = lighttime_truth.block(i,3,1,3).transpose();

		Eigen::Vector3d pos1;
		Eigen::Vector3d vel1;
		Eigen::Vector3d pos2 = propobj.pos_;
		Eigen::Vector3d vel2 = propobj.vel_;

		//approximate tof
		double tof = true_meas(i,2)/c;

		//propagate backwards in time to measurement
		// propobj.Propagate(-1.0*tof,false);

		pos1 = propobj.pos_;
		vel1 = propobj.vel_;

		std::cout << "Pos1: \n" << pos1 << "\n";
		std::cout << "Pos2: \n" << pos2 << "\n";
		std::cout << "Pos1 + tof*Vel1: \n" << pos1 + tof*vel1 << "\n";
		std::cout << "tof: " << tof << "\n";
		std::cout << "Pos1 + tof*Vel1 - Pos2: \n" << pos1 + tof*vel1 - pos2 << "\n";	

		//determine which tracking station was used
		int stationID = (int) true_meas(i, 0);

		switch(stationID) {
			case 1:
				obs_station_iter = obs_station1;
				break;

			case 2:
				obs_station_iter = obs_station2;
				break;

			case 3:
				obs_station_iter = obs_station3;
				break;

			default: std::cout << "Error: bad case in measurement \n";
		}

		//reset time
		propobj.t_ = lighttime_truth(i,6);

		//approximate measurement
		pred_meas.block(0,i,2,1) = propobj.GetRangeAndRate(obs_station_iter, 1.0*tof);

		// for (int j = 0; j < 5; ++j){

		// 	//approximate measurement
		// 	pred_meas.block(0,i,2,1) = propobj.GetRangeAndRate(obs_station_iter, 1.0*tof);

		// 	std::cout << "Change in ToF: " << tof - pred_meas(0,i)/c << "\n";

		// 	//reset time of flight
		// 	tof = pred_meas(0,i)/c;
		// }
		

		// exit(0);

	}

	//write out the predicted measurements
	Util::Eigen2csv("../data/pred_meas.csv", pred_meas);

	return 0;
}